

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

wchar_t percent_color(wchar_t val_cur,wchar_t val_max,nh_bool ishp)

{
  wchar_t wVar1;
  
  if (val_cur == val_max) {
    wVar1 = L'\a';
  }
  else {
    if (val_cur * 3 <= val_max * 2) {
      if (val_max < val_cur * 3) {
        return (uint)(ishp == '\0') * 3 + L'\x03';
      }
      if (val_max < val_cur * 7) {
        return (uint)(ishp != '\0') * 4 + L'\x05';
      }
      return (uint)(ishp == '\0') * 3 + L'\x01';
    }
    wVar1 = L'\x02';
  }
  return wVar1;
}

Assistant:

static int percent_color(int val_cur, int val_max, nh_bool ishp)
{
    int color;

    if (val_cur == val_max)
	color = CLR_GRAY;
    else if (val_cur * 3 > val_max * 2)
	color = CLR_GREEN;
    else if (val_cur * 3 > val_max * 1)
	color = ishp ? CLR_BROWN : CLR_CYAN;
    else if (val_cur * 7 > val_max * 1)
	color = ishp ? CLR_ORANGE : CLR_MAGENTA;
    else
	color = ishp ? CLR_RED : CLR_BLUE;

    return color;
}